

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char cVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  undefined4 uVar22;
  ulong unaff_RBP;
  NodeRef *pNVar23;
  NodeRef *pNVar24;
  ulong uVar25;
  ulong uVar26;
  size_t sVar27;
  ulong uVar28;
  vint4 ai_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 bi_1;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 ai_3;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi_3;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 ai;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  NodeRef stack [244];
  
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar10 = fVar4 * 0.99999964;
  fVar11 = fVar5 * 0.99999964;
  fVar12 = fVar6 * 0.99999964;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar7 = (tray->tnear).field_0.i[k];
  auVar58._4_4_ = iVar7;
  auVar58._0_4_ = iVar7;
  auVar58._8_4_ = iVar7;
  auVar58._12_4_ = iVar7;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar60._4_4_ = iVar7;
  auVar60._0_4_ = iVar7;
  auVar60._8_4_ = iVar7;
  auVar60._12_4_ = iVar7;
  pNVar24 = stack + 1;
  do {
    pNVar23 = pNVar24;
    if (pNVar23 == stack) break;
    pNVar24 = pNVar23 + -1;
    sVar27 = pNVar23[-1].ptr;
    do {
      if ((sVar27 & 8) == 0) {
        fVar8 = *(float *)(ray + k * 4 + 0x70);
        uVar19 = (uint)sVar27 & 7;
        uVar18 = sVar27 & 0xfffffffffffffff0;
        if (uVar19 == 3) {
          auVar30 = *(undefined1 (*) [16])(uVar18 + 0x80);
          auVar9 = *(undefined1 (*) [16])(uVar18 + 0x90);
          fVar13 = 1.0 - fVar8;
          auVar51._0_4_ = fVar8 * *(float *)(uVar18 + 0xe0);
          auVar51._4_4_ = fVar8 * *(float *)(uVar18 + 0xe4);
          auVar51._8_4_ = fVar8 * *(float *)(uVar18 + 0xe8);
          auVar51._12_4_ = fVar8 * *(float *)(uVar18 + 0xec);
          auVar57._0_4_ = fVar8 * *(float *)(uVar18 + 0xf0);
          auVar57._4_4_ = fVar8 * *(float *)(uVar18 + 0xf4);
          auVar57._8_4_ = fVar8 * *(float *)(uVar18 + 0xf8);
          auVar57._12_4_ = fVar8 * *(float *)(uVar18 + 0xfc);
          auVar35._0_4_ = fVar8 * *(float *)(uVar18 + 0x100);
          auVar35._4_4_ = fVar8 * *(float *)(uVar18 + 0x104);
          auVar35._8_4_ = fVar8 * *(float *)(uVar18 + 0x108);
          auVar35._12_4_ = fVar8 * *(float *)(uVar18 + 0x10c);
          auVar59._4_4_ = fVar13;
          auVar59._0_4_ = fVar13;
          auVar59._8_4_ = fVar13;
          auVar59._12_4_ = fVar13;
          auVar31._0_12_ = ZEXT812(0);
          auVar31._12_4_ = 0;
          auVar33 = vfmadd231ps_fma(auVar51,auVar59,auVar31);
          auVar37 = vfmadd231ps_fma(auVar57,auVar59,auVar31);
          auVar41 = vfmadd231ps_fma(auVar35,auVar59,auVar31);
          auVar44._0_4_ = fVar3 * auVar30._0_4_;
          auVar44._4_4_ = fVar3 * auVar30._4_4_;
          auVar44._8_4_ = fVar3 * auVar30._8_4_;
          auVar44._12_4_ = fVar3 * auVar30._12_4_;
          auVar53._0_4_ = fVar3 * auVar9._0_4_;
          auVar53._4_4_ = fVar3 * auVar9._4_4_;
          auVar53._8_4_ = fVar3 * auVar9._8_4_;
          auVar53._12_4_ = fVar3 * auVar9._12_4_;
          auVar16._4_4_ = uVar2;
          auVar16._0_4_ = uVar2;
          auVar16._8_4_ = uVar2;
          auVar16._12_4_ = uVar2;
          auVar31 = vfmadd231ps_fma(auVar44,auVar16,*(undefined1 (*) [16])(uVar18 + 0x50));
          auVar32 = vfmadd231ps_fma(auVar53,auVar16,*(undefined1 (*) [16])(uVar18 + 0x60));
          auVar15._4_4_ = uVar1;
          auVar15._0_4_ = uVar1;
          auVar15._8_4_ = uVar1;
          auVar15._12_4_ = uVar1;
          auVar35 = vfmadd231ps_fma(auVar31,auVar15,*(undefined1 (*) [16])(uVar18 + 0x20));
          auVar32 = vfmadd231ps_fma(auVar32,auVar15,*(undefined1 (*) [16])(uVar18 + 0x30));
          auVar61._8_4_ = 0x7fffffff;
          auVar61._0_8_ = 0x7fffffff7fffffff;
          auVar61._12_4_ = 0x7fffffff;
          auVar31 = vandps_avx(auVar61,auVar35);
          auVar56._8_4_ = 0x219392ef;
          auVar56._0_8_ = 0x219392ef219392ef;
          auVar56._12_4_ = 0x219392ef;
          auVar31 = vcmpps_avx(auVar31,auVar56,1);
          auVar35 = vblendvps_avx(auVar35,auVar56,auVar31);
          auVar31 = vandps_avx(auVar32,auVar61);
          auVar31 = vcmpps_avx(auVar31,auVar56,1);
          auVar38 = vblendvps_avx(auVar32,auVar56,auVar31);
          auVar50._0_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x120);
          auVar50._4_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x124);
          auVar50._8_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x128);
          auVar50._12_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 300);
          auVar54._0_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x130);
          auVar54._4_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x134);
          auVar54._8_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x138);
          auVar54._12_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x13c);
          auVar31 = *(undefined1 (*) [16])(uVar18 + 0xa0);
          auVar32._0_4_ = auVar31._0_4_ * fVar3;
          auVar32._4_4_ = auVar31._4_4_ * fVar3;
          auVar32._8_4_ = auVar31._8_4_ * fVar3;
          auVar32._12_4_ = auVar31._12_4_ * fVar3;
          auVar32 = vfmadd231ps_fma(auVar32,auVar16,*(undefined1 (*) [16])(uVar18 + 0x70));
          auVar16 = vfmadd231ps_fma(auVar32,auVar15,*(undefined1 (*) [16])(uVar18 + 0x40));
          auVar32 = vandps_avx(auVar61,auVar16);
          auVar32 = vcmpps_avx(auVar32,auVar56,1);
          auVar32 = vblendvps_avx(auVar16,auVar56,auVar32);
          auVar16 = vrcpps_avx(auVar35);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = &DAT_3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar35 = vfnmadd213ps_fma(auVar35,auVar16,auVar36);
          auVar16 = vfmadd132ps_fma(auVar35,auVar16,auVar16);
          auVar35 = vrcpps_avx(auVar38);
          auVar38 = vfnmadd213ps_fma(auVar38,auVar35,auVar36);
          auVar15 = vfmadd132ps_fma(auVar38,auVar35,auVar35);
          auVar35 = vrcpps_avx(auVar32);
          auVar32 = vfnmadd213ps_fma(auVar32,auVar35,auVar36);
          auVar36 = vfmadd132ps_fma(auVar32,auVar35,auVar35);
          auVar30 = vfmadd213ps_fma(auVar30,auVar48,*(undefined1 (*) [16])(uVar18 + 0xb0));
          auVar9 = vfmadd213ps_fma(auVar9,auVar48,*(undefined1 (*) [16])(uVar18 + 0xc0));
          auVar32 = vfmadd231ps_fma(auVar30,*(undefined1 (*) [16])(uVar18 + 0x50),auVar55);
          auVar9 = vfmadd231ps_fma(auVar9,*(undefined1 (*) [16])(uVar18 + 0x60),auVar55);
          auVar30 = vfmadd213ps_fma(auVar31,auVar48,*(undefined1 (*) [16])(uVar18 + 0xd0));
          auVar30 = vfmadd231ps_fma(auVar30,auVar55,*(undefined1 (*) [16])(uVar18 + 0x70));
          auVar31 = vfmadd231ps_fma(auVar32,auVar52,*(undefined1 (*) [16])(uVar18 + 0x20));
          auVar32 = vfmadd231ps_fma(auVar9,auVar52,*(undefined1 (*) [16])(uVar18 + 0x30));
          auVar38 = vfmadd231ps_fma(auVar30,auVar52,*(undefined1 (*) [16])(uVar18 + 0x40));
          auVar30 = vsubps_avx(auVar33,auVar31);
          auVar9._4_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x114);
          auVar9._0_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x110);
          auVar9._8_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x118);
          auVar9._12_4_ = fVar13 + fVar8 * *(float *)(uVar18 + 0x11c);
          auVar9 = vsubps_avx(auVar9,auVar31);
          auVar31 = vsubps_avx(auVar37,auVar32);
          auVar32 = vsubps_avx(auVar50,auVar32);
          auVar35 = vsubps_avx(auVar41,auVar38);
          auVar38 = vsubps_avx(auVar54,auVar38);
          auVar33._0_4_ = auVar16._0_4_ * auVar30._0_4_;
          auVar33._4_4_ = auVar16._4_4_ * auVar30._4_4_;
          auVar33._8_4_ = auVar16._8_4_ * auVar30._8_4_;
          auVar33._12_4_ = auVar16._12_4_ * auVar30._12_4_;
          auVar37._0_4_ = auVar16._0_4_ * auVar9._0_4_;
          auVar37._4_4_ = auVar16._4_4_ * auVar9._4_4_;
          auVar37._8_4_ = auVar16._8_4_ * auVar9._8_4_;
          auVar37._12_4_ = auVar16._12_4_ * auVar9._12_4_;
          auVar41._0_4_ = auVar15._0_4_ * auVar31._0_4_;
          auVar41._4_4_ = auVar15._4_4_ * auVar31._4_4_;
          auVar41._8_4_ = auVar15._8_4_ * auVar31._8_4_;
          auVar41._12_4_ = auVar15._12_4_ * auVar31._12_4_;
          auVar47._0_4_ = auVar36._0_4_ * auVar35._0_4_;
          auVar47._4_4_ = auVar36._4_4_ * auVar35._4_4_;
          auVar47._8_4_ = auVar36._8_4_ * auVar35._8_4_;
          auVar47._12_4_ = auVar36._12_4_ * auVar35._12_4_;
          auVar45._0_4_ = auVar15._0_4_ * auVar32._0_4_;
          auVar45._4_4_ = auVar15._4_4_ * auVar32._4_4_;
          auVar45._8_4_ = auVar15._8_4_ * auVar32._8_4_;
          auVar45._12_4_ = auVar15._12_4_ * auVar32._12_4_;
          auVar49._0_4_ = auVar36._0_4_ * auVar38._0_4_;
          auVar49._4_4_ = auVar36._4_4_ * auVar38._4_4_;
          auVar49._8_4_ = auVar36._8_4_ * auVar38._8_4_;
          auVar49._12_4_ = auVar36._12_4_ * auVar38._12_4_;
          auVar30 = vpminsd_avx(auVar41,auVar45);
          auVar9 = vpminsd_avx(auVar47,auVar49);
          auVar30 = vmaxps_avx(auVar30,auVar9);
          auVar35 = vpminsd_avx(auVar33,auVar37);
          auVar32 = vpmaxsd_avx(auVar33,auVar37);
          auVar9 = vpmaxsd_avx(auVar41,auVar45);
          auVar31 = vpmaxsd_avx(auVar47,auVar49);
          auVar31 = vminps_avx(auVar9,auVar31);
          auVar9 = vmaxps_avx(auVar58,auVar35);
          auVar30 = vmaxps_avx(auVar9,auVar30);
          auVar9 = vminps_avx(auVar60,auVar32);
          auVar9 = vminps_avx(auVar9,auVar31);
          auVar38._0_4_ = auVar30._0_4_ * 0.99999964;
          auVar38._4_4_ = auVar30._4_4_ * 0.99999964;
          auVar38._8_4_ = auVar30._8_4_ * 0.99999964;
          auVar38._12_4_ = auVar30._12_4_ * 0.99999964;
          auVar30._0_4_ = auVar9._0_4_ * 1.0000004;
          auVar30._4_4_ = auVar9._4_4_ * 1.0000004;
          auVar30._8_4_ = auVar9._8_4_ * 1.0000004;
          auVar30._12_4_ = auVar9._12_4_ * 1.0000004;
          auVar30 = vcmpps_avx(auVar38,auVar30,2);
        }
        else {
          auVar29._4_4_ = fVar8;
          auVar29._0_4_ = fVar8;
          auVar29._8_4_ = fVar8;
          auVar29._12_4_ = fVar8;
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar25),auVar29,
                                    *(undefined1 (*) [16])(uVar18 + 0x20 + uVar25));
          auVar30 = vsubps_avx(auVar30,auVar52);
          auVar34._0_4_ = fVar10 * auVar30._0_4_;
          auVar34._4_4_ = fVar10 * auVar30._4_4_;
          auVar34._8_4_ = fVar10 * auVar30._8_4_;
          auVar34._12_4_ = fVar10 * auVar30._12_4_;
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar21),auVar29,
                                    *(undefined1 (*) [16])(uVar18 + 0x20 + uVar21));
          auVar30 = vsubps_avx(auVar30,auVar55);
          auVar39._0_4_ = fVar11 * auVar30._0_4_;
          auVar39._4_4_ = fVar11 * auVar30._4_4_;
          auVar39._8_4_ = fVar11 * auVar30._8_4_;
          auVar39._12_4_ = fVar11 * auVar30._12_4_;
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar28),auVar29,
                                    *(undefined1 (*) [16])(uVar18 + 0x20 + uVar28));
          auVar30 = vsubps_avx(auVar30,auVar48);
          auVar42._0_4_ = fVar12 * auVar30._0_4_;
          auVar42._4_4_ = fVar12 * auVar30._4_4_;
          auVar42._8_4_ = fVar12 * auVar30._8_4_;
          auVar42._12_4_ = fVar12 * auVar30._12_4_;
          auVar30 = vmaxps_avx(auVar39,auVar42);
          auVar9 = vmaxps_avx(auVar58,auVar34);
          auVar30 = vmaxps_avx(auVar9,auVar30);
          auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + (uVar25 ^ 0x10)),auVar29,
                                   *(undefined1 (*) [16])(uVar18 + 0x20 + (uVar25 ^ 0x10)));
          auVar9 = vsubps_avx(auVar9,auVar52);
          auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + (uVar21 ^ 0x10)),auVar29,
                                    *(undefined1 (*) [16])(uVar18 + 0x20 + (uVar21 ^ 0x10)));
          auVar40._0_4_ = fVar4 * auVar9._0_4_;
          auVar40._4_4_ = fVar4 * auVar9._4_4_;
          auVar40._8_4_ = fVar4 * auVar9._8_4_;
          auVar40._12_4_ = fVar4 * auVar9._12_4_;
          auVar9 = vsubps_avx(auVar31,auVar55);
          auVar43._0_4_ = fVar5 * auVar9._0_4_;
          auVar43._4_4_ = fVar5 * auVar9._4_4_;
          auVar43._8_4_ = fVar5 * auVar9._8_4_;
          auVar43._12_4_ = fVar5 * auVar9._12_4_;
          auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + (uVar28 ^ 0x10)),auVar29,
                                   *(undefined1 (*) [16])(uVar18 + 0x20 + (uVar28 ^ 0x10)));
          auVar9 = vsubps_avx(auVar9,auVar48);
          auVar46._0_4_ = fVar6 * auVar9._0_4_;
          auVar46._4_4_ = fVar6 * auVar9._4_4_;
          auVar46._8_4_ = fVar6 * auVar9._8_4_;
          auVar46._12_4_ = fVar6 * auVar9._12_4_;
          auVar9 = vminps_avx(auVar43,auVar46);
          auVar31 = vminps_avx(auVar60,auVar40);
          auVar9 = vminps_avx(auVar31,auVar9);
          if (uVar19 == 6) {
            auVar9 = vcmpps_avx(auVar30,auVar9,2);
            auVar30 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0xe0),auVar29,2);
            auVar31 = vcmpps_avx(auVar29,*(undefined1 (*) [16])(uVar18 + 0xf0),1);
            auVar30 = vandps_avx(auVar30,auVar31);
            auVar30 = vandps_avx(auVar30,auVar9);
          }
          else {
            auVar30 = vcmpps_avx(auVar30,auVar9,2);
          }
          auVar30 = vpslld_avx(auVar30,0x1f);
        }
        uVar22 = vmovmskps_avx(auVar30);
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar22);
      }
      if ((sVar27 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar19 = 4;
        }
        else {
          uVar26 = sVar27 & 0xfffffffffffffff0;
          lVar20 = 0;
          for (uVar18 = unaff_RBP; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar19 = 0;
          for (uVar18 = unaff_RBP - 1 & unaff_RBP; sVar27 = *(size_t *)(uVar26 + lVar20 * 8),
              uVar18 != 0; uVar18 = uVar18 - 1 & uVar18) {
            pNVar24->ptr = sVar27;
            pNVar24 = pNVar24 + 1;
            lVar20 = 0;
            for (uVar14 = uVar18; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
          }
        }
      }
      else {
        uVar19 = 6;
      }
    } while (uVar19 == 0);
    if (uVar19 == 6) {
      cVar17 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar27 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar19 = 0;
      if (cVar17 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar19 = 1;
      }
    }
  } while ((uVar19 & 3) == 0);
  return pNVar23 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }